

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNCnst.cpp
# Opt level: O3

void __thiscall NaPNConstGen::set_const_value(NaPNConstGen *this,NaReal *fConst)

{
  uint uVar1;
  NaReal *pNVar2;
  undefined4 *puVar3;
  ulong uVar4;
  
  if (fConst != (NaReal *)0x0) {
    uVar1 = this->nOutDim;
    if ((ulong)uVar1 != 0) {
      pNVar2 = this->fConstVal;
      uVar4 = 0;
      do {
        pNVar2[uVar4] = fConst[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    return;
  }
  puVar3 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar3 = 0;
  __cxa_throw(puVar3,&NaException::typeinfo,0);
}

Assistant:

void
NaPNConstGen::set_const_value (const NaReal* fConst)
{
    //!!!check_tunable();

    if(NULL == fConst)
        throw(na_null_pointer);

    unsigned    i;
    for(i = 0; i < nOutDim; ++i){
        fConstVal[i] = fConst[i];
    }
}